

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cangen.c
# Opt level: O0

int do_send_one(int fd,void *buf,size_t len,int timeout)

{
  int iVar1;
  long lVar2;
  ssize_t sVar3;
  int *piVar4;
  int in_ECX;
  size_t in_RDX;
  void *in_RSI;
  int in_EDI;
  timespec tVar5;
  pollfd fds;
  uint64_t tdeliver;
  cmsghdr *cm;
  int ret;
  ssize_t nbytes;
  msghdr msg;
  iovec iov;
  uint8_t control [24];
  undefined8 *local_c0;
  pollfd local_b8;
  timespec in_stack_ffffffffffffff50;
  __syscall_slong_t in_stack_ffffffffffffff68;
  msghdr local_80;
  iovec local_48;
  undefined8 local_38 [3];
  int local_1c;
  size_t local_18;
  void *local_10;
  int local_8;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_EDI;
  memset(local_38,0,0x18);
  local_48.iov_base = local_10;
  local_48.iov_len = local_18;
  local_80.msg_name = (void *)0x0;
  local_80.msg_namelen = 0;
  local_80.msg_iov = &local_48;
  local_80.msg_iovlen = 1;
  local_80.msg_control = (undefined8 *)0x0;
  local_80.msg_controllen = 0;
  local_80.msg_flags = 0;
  if ((use_so_txtime & 1U) != 0) {
    local_80.msg_control = local_38;
    local_80.msg_controllen = 0x18;
    lVar2 = ts.tv_sec * 1000000000 + ts.tv_nsec;
    tVar5.tv_nsec = in_stack_ffffffffffffff68;
    tVar5.tv_sec = lVar2;
    tVar5 = timespec_add(tVar5,in_stack_ffffffffffffff50);
    ts.tv_sec = tVar5.tv_sec;
    ts.tv_nsec = tVar5.tv_nsec;
    if (local_80.msg_controllen < 0x10) {
      local_c0 = (undefined8 *)0x0;
    }
    else {
      local_c0 = (undefined8 *)local_80.msg_control;
    }
    *(undefined4 *)(local_c0 + 1) = 1;
    *(undefined4 *)((long)local_c0 + 0xc) = 0x3d;
    *local_c0 = 0x18;
    local_c0[2] = lVar2;
  }
  do {
    sVar3 = sendmsg(local_8,&local_80,0);
    if (-1 < sVar3) {
      if ((long)local_18 <= sVar3) {
        return 0;
      }
      fprintf(_stderr,"write: incomplete CAN frame\n");
      return -0x16;
    }
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    if (-iVar1 != -0x69) {
      perror("write");
      return -iVar1;
    }
    if (((ignore_enobufs & 1U) == 0) && (local_1c == 0)) {
      perror("write");
      return -0x69;
    }
    if (local_1c == 0) {
      enobufs_count = enobufs_count + 1;
      return 0;
    }
    local_b8.fd = local_8;
    local_b8.events = 4;
    local_b8.revents = 0;
    iVar1 = poll(&local_b8,1,local_1c);
  } while ((iVar1 != 0) && ((iVar1 != -1 || (piVar4 = __errno_location(), *piVar4 == 4))));
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  perror("poll");
  return -iVar1;
}

Assistant:

static int do_send_one(int fd, void *buf, size_t len, int timeout)
{
	uint8_t control[CMSG_SPACE(sizeof(uint64_t))] = { 0 };
	struct iovec iov = {
		.iov_base = buf,
		.iov_len = len,
	};
	struct msghdr msg = {
		.msg_iov = &iov,
		.msg_iovlen = 1,
	};
	ssize_t nbytes;
	int ret;

	if (use_so_txtime) {
		struct cmsghdr *cm;
		uint64_t tdeliver;

		msg.msg_control = control;
		msg.msg_controllen = sizeof(control);

		tdeliver = ts.tv_sec * NSEC_PER_SEC + ts.tv_nsec;
		ts = timespec_add(ts, ts_gap);

		cm = CMSG_FIRSTHDR(&msg);
		cm->cmsg_level = SOL_SOCKET;
		cm->cmsg_type = SCM_TXTIME;
		cm->cmsg_len = CMSG_LEN(sizeof(tdeliver));
		memcpy(CMSG_DATA(cm), &tdeliver, sizeof(tdeliver));
	}

 resend:
	nbytes = sendmsg(fd, &msg, 0);
	if (nbytes < 0) {
		ret = -errno;
		if (ret != -ENOBUFS) {
			perror("write");
			return ret;
		}
		if (!ignore_enobufs && !timeout) {
			perror("write");
			return ret;
		}
		if (timeout) {
			struct pollfd fds = {
				.fd = fd,
				.events = POLLOUT,
			};

			/* wait for the write socket (with timeout) */
			ret = poll(&fds, 1, timeout);
			if (ret == 0 || (ret == -1 && errno != EINTR)) {
				ret = -errno;
				perror("poll");
				return ret;
			}
			goto resend;
		} else {
			enobufs_count++;
		}

	} else if (nbytes < (ssize_t)len) {
		fprintf(stderr, "write: incomplete CAN frame\n");
		return -EINVAL;
	}

	return 0;
}